

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O1

QByteArray * __thiscall
QHttpNetworkReply::readAll(QByteArray *__return_storage_ptr__,QHttpNetworkReply *this)

{
  long lVar1;
  Data *pDVar2;
  size_t in_RCX;
  QByteArray *byteData;
  
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QByteArray::resize((longlong)__return_storage_ptr__);
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData
              ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size);
  }
  QByteDataBuffer::read
            ((QByteDataBuffer *)(lVar1 + 400),(int)(__return_storage_ptr__->d).ptr,
             (void *)(__return_storage_ptr__->d).size,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QHttpNetworkReply::readAll()
{
    Q_D(QHttpNetworkReply);
    return d->responseData.readAll();
}